

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O1

void __thiscall lscpp::comm_logger::open_in(comm_logger *this)

{
  int __oflag;
  long *local_38 [2];
  long local_28 [2];
  
  if (this->file_open_ == false) {
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,".in","");
    open(this,(char *)local_38,__oflag);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  return;
}

Assistant:

void comm_logger::open_in() {
  if (!file_open_)
    open(".in");
}